

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool tinyusdz::anon_unknown_240::HasVariantRec(uint32_t depth,PrimSpec *primspec,uint32_t max_depth)

{
  pointer pPVar1;
  bool bVar2;
  PrimSpec *child;
  pointer primspec_00;
  bool bVar3;
  
  if (max_depth < depth) {
    bVar2 = false;
  }
  else if (((primspec->_metas).variants.has_value_ != true) ||
          (bVar2 = true, (primspec->_metas).variantSets.has_value_ == false)) {
    primspec_00 = (primspec->_children).
                  super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (primspec->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      bVar3 = primspec_00 == pPVar1;
      bVar2 = !bVar3;
      if (bVar3) {
        return bVar2;
      }
      bVar3 = HasVariantRec(depth + 1,primspec_00,max_depth);
      primspec_00 = primspec_00 + 1;
    } while (!bVar3);
  }
  return bVar2;
}

Assistant:

bool HasVariantRec(uint32_t depth, const PrimSpec &primspec,
                   const uint32_t max_depth = 1024 * 128) {
  if (depth > max_depth) {
    // too deep
    return false;
  }

  // TODO: Also check if PrimSpec::variantSets is empty?
  if (primspec.metas().variants && primspec.metas().variantSets) {
    return true;
  }

  for (auto &child : primspec.children()) {
    if (HasVariantRec(depth + 1, child, max_depth)) {
      return true;
    }
  }

  return false;
}